

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_SPCod_SPCoc
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 compno,OPJ_BYTE *p_header_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr *p_manager)

{
  byte *pbVar1;
  OPJ_UINT32 *p_value;
  uint uVar2;
  opj_tcp_v2_t *poVar3;
  uint uVar4;
  ulong uVar5;
  opj_tccp_t *poVar6;
  OPJ_UINT32 l_tmp;
  uint local_3c;
  opj_event_mgr_t *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar3 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (4 < *p_header_size) {
    poVar6 = poVar3->tccps + compno;
    p_value = &poVar6->numresolutions;
    local_38 = p_manager;
    opj_read_bytes_LE(p_header_data,p_value,1);
    uVar2 = poVar6->numresolutions + 1;
    poVar6->numresolutions = uVar2;
    if (uVar2 <= (p_j2k->m_cp).m_specific_param.m_dec.m_reduce) {
      opj_event_msg_v2(local_38,1,
                       "Error decoding component %d.\nThe number of resolutions to remove is higher than the number of resolutions of this component\nModify the cp_reduce parameter.\n\n"
                       ,(ulong)compno);
      pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 1);
      *pbVar1 = *pbVar1 | 0x80;
      return 0;
    }
    opj_read_bytes_LE(p_header_data + 1,&poVar6->cblkw,1);
    poVar6->cblkw = poVar6->cblkw + 2;
    opj_read_bytes_LE(p_header_data + 2,&poVar6->cblkh,1);
    poVar6->cblkh = poVar6->cblkh + 2;
    opj_read_bytes_LE(p_header_data + 3,&poVar6->cblksty,1);
    opj_read_bytes_LE(p_header_data + 4,&poVar6->qmfbid,1);
    uVar2 = *p_header_size - 5;
    *p_header_size = uVar2;
    if ((poVar6->csty & 1) == 0) {
      uVar2 = *p_value;
      if ((ulong)uVar2 == 0) {
        return 1;
      }
      uVar5 = 0;
      do {
        poVar6->prcw[uVar5] = 0xf;
        poVar6->prch[uVar5] = 0xf;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
      return 1;
    }
    p_manager = local_38;
    if (*p_value <= uVar2) {
      if (*p_value == 0) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          opj_read_bytes_LE(p_header_data + uVar5 + 5,&local_3c,1);
          poVar6->prcw[uVar5] = local_3c & 0xf;
          poVar6->prch[uVar5] = local_3c >> 4;
          uVar5 = uVar5 + 1;
          uVar4 = poVar6->numresolutions;
        } while (uVar5 < uVar4);
        uVar2 = *p_header_size;
      }
      *p_header_size = uVar2 - uVar4;
      return 1;
    }
  }
  opj_event_msg_v2(p_manager,1,"Error reading SPCod SPCoc element\n");
  return 0;
}

Assistant:

opj_bool j2k_read_SPCod_SPCoc(
						    opj_j2k_v2_t *p_j2k,
							OPJ_UINT32 compno,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 * p_header_size,
							struct opj_event_mgr * p_manager
							)
{
	OPJ_UINT32 i, l_tmp;
	opj_cp_v2_t *l_cp = NULL;
	opj_tcp_v2_t *l_tcp = NULL;
	opj_tccp_t *l_tccp = NULL;
	OPJ_BYTE * l_current_ptr = NULL;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* precondition again */
	assert(compno < p_j2k->m_private_image->numcomps);

	l_tccp = &l_tcp->tccps[compno];
	l_current_ptr = p_header_data;

	/* make sure room is sufficient */
	if (*p_header_size < 5) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(l_current_ptr, &l_tccp->numresolutions ,1);		/* SPcox (D) */
	++l_tccp->numresolutions;										/* tccp->numresolutions = read() + 1 */
	++l_current_ptr;

	/* If user wants to remove more resolutions than the codestream contains, return error */
	if (l_cp->m_specific_param.m_dec.m_reduce >= l_tccp->numresolutions) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error decoding component %d.\nThe number of resolutions to remove is higher than the number "
					"of resolutions of this component\nModify the cp_reduce parameter.\n\n", compno);
		p_j2k->m_specific_param.m_decoder.m_state |= 0x8000;/* FIXME J2K_DEC_STATE_ERR;*/
		return OPJ_FALSE;
	}

	opj_read_bytes(l_current_ptr,&l_tccp->cblkw ,1);		/* SPcoc (E) */
	++l_current_ptr;
	l_tccp->cblkw += 2;

	opj_read_bytes(l_current_ptr,&l_tccp->cblkh ,1);		/* SPcoc (F) */
	++l_current_ptr;
	l_tccp->cblkh += 2;

	opj_read_bytes(l_current_ptr,&l_tccp->cblksty ,1);		/* SPcoc (G) */
	++l_current_ptr;

	opj_read_bytes(l_current_ptr,&l_tccp->qmfbid ,1);		/* SPcoc (H) */
	++l_current_ptr;

	*p_header_size = *p_header_size - 5;

	/* use custom precinct size ? */
	if (l_tccp->csty & J2K_CCP_CSTY_PRT) {
		if (*p_header_size < l_tccp->numresolutions) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
			return OPJ_FALSE;
		}

		for	(i = 0; i < l_tccp->numresolutions; ++i) {
			opj_read_bytes(l_current_ptr,&l_tmp ,1);		/* SPcoc (I_i) */
			++l_current_ptr;
			l_tccp->prcw[i] = l_tmp & 0xf;
			l_tccp->prch[i] = l_tmp >> 4;
		}

		*p_header_size = *p_header_size - l_tccp->numresolutions;
	}
	else {
		/* set default size for the precinct width and height */
		for	(i = 0; i < l_tccp->numresolutions; ++i) {
			l_tccp->prcw[i] = 15;
			l_tccp->prch[i] = 15;
		}
	}

#ifdef WIP_REMOVE_MSD
	/* INDEX >> */
	if (p_j2k->cstr_info && compno == 0) {
		OPJ_UINT32 l_data_size = l_tccp->numresolutions * sizeof(OPJ_UINT32);

		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkh = l_tccp->cblkh;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkw = l_tccp->cblkw;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].numresolutions = l_tccp->numresolutions;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblksty = l_tccp->cblksty;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].qmfbid = l_tccp->qmfbid;


		memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdx,l_tccp->prcw, l_data_size);
		memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdy,l_tccp->prch, l_data_size);
	}
	/* << INDEX */
#endif

	return OPJ_TRUE;
}